

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_outbound.hpp
# Opt level: O3

ostream * std::operator<<(ostream *os,
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *mp)

{
  undefined8 in_RAX;
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  char *pcVar3;
  _Self __tmp;
  undefined8 uStack_28;
  
  if ((mp->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pcVar3 = "{}";
    lVar2 = 2;
    uStack_28 = in_RAX;
  }
  else {
    uStack_28._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_28._0_7_ = CONCAT16(0x7b,(int6)in_RAX);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 6),1);
    p_Var1 = (mp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    operator<<(os,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(p_Var1 + 1));
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    for (; (_Rb_tree_header *)p_Var1 != &(mp->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      operator<<(os,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(p_Var1 + 1));
    }
    pcVar3 = (char *)((long)&uStack_28 + 7);
    uStack_28 = CONCAT17(0x7d,(undefined7)uStack_28);
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

ostream& operator << (ostream& os, const map<T1, T2>& mp)
        {
            if(mp.empty())
            {
                os<<"{}";
                return os;
            }
            os<<'{';
            typename map<T1, T2>::const_iterator it = mp.begin();
            os<<*it;
            it++;
            while(it != mp.end())
            {
                os<<", "<<*it;
                it++;
            }
            os<<'}';
            return os;
        }